

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

UCollationResult __thiscall
icu_63::RuleBasedCollator::compareUTF8
          (RuleBasedCollator *this,StringPiece *left,StringPiece *right,UErrorCode *errorCode)

{
  byte *pbVar1;
  byte bVar2;
  uint8_t *s;
  uint8_t *s_00;
  Normalizer2Impl *nfcImpl;
  byte numeric;
  UBool UVar3;
  uint uVar4;
  UCollationResult UVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  CollationSettings *pCVar13;
  int32_t leftLength;
  int iVar14;
  uint uStack_464;
  uint uStack_460;
  uint uStack_45c;
  UErrorCode *pUStack_458;
  undefined1 auStack_450 [32];
  UObject UStack_430;
  int32_t iStack_428;
  int iStack_424;
  undefined1 auStack_240 [32];
  UObject UStack_220;
  int32_t iStack_218;
  int iStack_214;
  
  if (U_ZERO_ERROR < *errorCode) {
    return UCOL_EQUAL;
  }
  s = (uint8_t *)left->ptr_;
  uStack_460 = left->length_;
  if (uStack_460 != 0 && s == (uint8_t *)0x0) {
LAB_0021bb5b:
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return UCOL_EQUAL;
  }
  s_00 = (uint8_t *)right->ptr_;
  uStack_45c = right->length_;
  if (uStack_45c != 0 && s_00 == (uint8_t *)0x0) goto LAB_0021bb5b;
  if (s == s_00 && uStack_460 == uStack_45c) {
    return UCOL_EQUAL;
  }
  uStack_464 = 0;
  if ((int)uStack_460 < 0) {
    uVar12 = 0;
    while (s[uVar12] == s_00[uVar12]) {
      if (s[uVar12] == '\0') {
        return UCOL_EQUAL;
      }
      uVar12 = uVar12 + 1;
      uStack_464 = (uint)uVar12;
    }
LAB_0021bbdc:
    uVar9 = uVar12 & 0xffffffff;
  }
  else {
    uVar9 = (ulong)uStack_460;
    uVar12 = 0;
    while (uVar9 != uVar12) {
      if ((long)(int)uStack_45c == uVar12) {
        uVar9 = (ulong)uStack_45c;
        goto LAB_0021bbef;
      }
      if (s[uVar12] != s_00[uVar12]) goto LAB_0021bbdc;
      uVar12 = uVar12 + 1;
      uStack_464 = (uint)uVar12;
    }
    if (uStack_460 == uStack_45c) {
      return UCOL_EQUAL;
    }
  }
LAB_0021bbef:
  uVar11 = (uint)uVar12;
  uVar4 = (uint)uVar9;
  if ((0 < (int)uVar4) &&
     (((uVar4 != uStack_460 && ((char)s[uVar9] < -0x40)) ||
      ((uVar4 != uStack_45c && ((char)s_00[uVar9] < -0x40)))))) {
    uVar12 = uVar12 & 0xffffffff;
    do {
      iVar14 = (int)uVar12;
      if (iVar14 < 2) break;
      uVar12 = uVar12 - 1;
    } while ((char)s[uVar12 & 0xffffffff] < -0x40);
    uVar11 = iVar14 - 1;
    uStack_464 = uVar11;
  }
  numeric = (byte)this->settings->options >> 1 & 1;
  pUStack_458 = errorCode;
  if (0 < (int)uVar11) {
    uVar12 = (ulong)uVar11;
    if (uVar11 == uStack_460) {
LAB_0021bc88:
      if (uVar11 != uStack_45c) {
        bVar2 = s_00[uVar12];
        uVar4 = (uint)bVar2;
        if ((char)bVar2 < '\0') {
          uVar9 = uVar12 + 1;
          uVar4 = 0xfffd;
          if ((uint)uVar9 != uStack_45c) {
            if (bVar2 < 0xe0) {
              if (0xc1 < bVar2) {
                uVar11 = bVar2 & 0x1f;
LAB_0021c065:
                if ((byte)(s_00[uVar9 & 0xffffffff] ^ 0x80) < 0x40) {
                  uVar4 = uVar11 << 6 | s_00[uVar9 & 0xffffffff] ^ 0x80;
                }
              }
            }
            else if (bVar2 < 0xf0) {
              uVar11 = bVar2 & 0xf;
              if (((byte)" 000000000000\x1000"[uVar11] >> (s_00[uVar9] >> 5) & 1) != 0) {
                bVar10 = s_00[uVar9] & 0x3f;
LAB_0021c016:
                uVar8 = (int)uVar9 + 1;
                uVar9 = (ulong)uVar8;
                if (uVar8 != uStack_45c) {
                  uVar11 = (uint)bVar10 | uVar11 << 6;
                  goto LAB_0021c065;
                }
              }
            }
            else if (bVar2 < 0xf5) {
              pbVar1 = s_00 + uVar9;
              if (((((uint)(int)""[*pbVar1 >> 4] >> (bVar2 - 0xf0 & 0x1f) & 1) != 0) &&
                  (uVar9 = uVar12 + 2, (uint)uVar9 != uStack_45c)) &&
                 (bVar10 = s_00[uVar9] + 0x80, bVar10 < 0x40)) {
                uVar11 = *pbVar1 & 0x3f | (bVar2 - 0xf0) * 0x40;
                goto LAB_0021c016;
              }
            }
          }
        }
        UVar3 = CollationData::isUnsafeBackward(this->data,uVar4,numeric);
        if (UVar3 != '\0') goto LAB_0021bcbf;
      }
    }
    else {
      bVar2 = s[uVar12];
      uVar4 = (uint)bVar2;
      if ((char)bVar2 < '\0') {
        uVar9 = uVar12 + 1;
        uVar4 = 0xfffd;
        if ((uint)uVar9 != uStack_460) {
          if (bVar2 < 0xe0) {
            if (0xc1 < bVar2) {
              uVar8 = bVar2 & 0x1f;
LAB_0021c038:
              if ((byte)(s[uVar9 & 0xffffffff] ^ 0x80) < 0x40) {
                uVar4 = uVar8 << 6 | s[uVar9 & 0xffffffff] ^ 0x80;
              }
            }
          }
          else if (bVar2 < 0xf0) {
            uVar8 = bVar2 & 0xf;
            if (((byte)" 000000000000\x1000"[uVar8] >> (s[uVar9] >> 5) & 1) != 0) {
              bVar10 = s[uVar9] & 0x3f;
LAB_0021bfc8:
              uVar7 = (int)uVar9 + 1;
              uVar9 = (ulong)uVar7;
              if (uVar7 != uStack_460) {
                uVar8 = (uint)bVar10 | uVar8 << 6;
                goto LAB_0021c038;
              }
            }
          }
          else if (bVar2 < 0xf5) {
            pbVar1 = s + uVar9;
            if (((((uint)(int)""[*pbVar1 >> 4] >> (bVar2 - 0xf0 & 0x1f) & 1) != 0) &&
                (uVar9 = uVar12 + 2, (uint)uVar9 != uStack_460)) &&
               (bVar10 = s[uVar9] + 0x80, bVar10 < 0x40)) {
              uVar8 = *pbVar1 & 0x3f | (bVar2 - 0xf0) * 0x40;
              goto LAB_0021bfc8;
            }
          }
        }
      }
      UVar3 = CollationData::isUnsafeBackward(this->data,uVar4,numeric);
      if (UVar3 == '\0') goto LAB_0021bc88;
LAB_0021bcbf:
      do {
        lVar6 = (long)(int)uStack_464;
        uStack_464 = uStack_464 - 1;
        bVar2 = s[lVar6 + -1];
        uVar4 = (uint)bVar2;
        if ((char)bVar2 < '\0') {
          uVar4 = utf8_prevCharSafeBody_63(s,0,(int32_t *)&uStack_464,(uint)bVar2,-3);
        }
      } while ((0 < (int)uStack_464) &&
              (UVar3 = CollationData::isUnsafeBackward(this->data,uVar4,numeric), UVar3 != '\0'));
    }
  }
  uVar4 = uStack_45c;
  pCVar13 = this->settings;
  if (((-1 < pCVar13->fastLatinOptions) &&
      ((lVar6 = (long)(int)uStack_464, uStack_460 == uStack_464 || (s[lVar6] < 0xc6)))) &&
     ((uStack_45c == uStack_464 || (s_00[lVar6] < 0xc6)))) {
    if ((int)uStack_460 < 0) {
      iVar14 = -1;
      leftLength = -1;
    }
    else {
      leftLength = uStack_460 - uStack_464;
      iVar14 = uStack_45c - uStack_464;
    }
    UVar5 = CollationFastLatin::compareUTF8
                      (this->data->fastLatinTable,pCVar13->fastLatinPrimaries,
                       pCVar13->fastLatinOptions,s + lVar6,leftLength,s_00 + lVar6,iVar14);
    if (UVar5 != ~UCOL_GREATER) goto LAB_0021be7d;
    pCVar13 = this->settings;
  }
  if ((pCVar13->options & 1) == 0) {
    UTF8CollationIterator::UTF8CollationIterator
              ((UTF8CollationIterator *)auStack_240,this->data,numeric,s,uStack_464,uStack_460);
    UTF8CollationIterator::UTF8CollationIterator
              ((UTF8CollationIterator *)auStack_450,this->data,numeric,s_00,uStack_464,uVar4);
    UVar5 = CollationCompare::compareUpToQuaternary
                      ((CollationIterator *)auStack_240,(CollationIterator *)auStack_450,
                       this->settings,pUStack_458);
    UTF8CollationIterator::~UTF8CollationIterator((UTF8CollationIterator *)auStack_450);
    UTF8CollationIterator::~UTF8CollationIterator((UTF8CollationIterator *)auStack_240);
  }
  else {
    FCDUTF8CollationIterator::FCDUTF8CollationIterator
              ((FCDUTF8CollationIterator *)auStack_240,this->data,numeric,s,uStack_464,uStack_460);
    FCDUTF8CollationIterator::FCDUTF8CollationIterator
              ((FCDUTF8CollationIterator *)auStack_450,this->data,numeric,s_00,uStack_464,uVar4);
    UVar5 = CollationCompare::compareUpToQuaternary
                      ((CollationIterator *)auStack_240,(CollationIterator *)auStack_450,
                       this->settings,pUStack_458);
    FCDUTF8CollationIterator::~FCDUTF8CollationIterator((FCDUTF8CollationIterator *)auStack_450);
    FCDUTF8CollationIterator::~FCDUTF8CollationIterator((FCDUTF8CollationIterator *)auStack_240);
  }
LAB_0021be7d:
  if (UVar5 == UCOL_EQUAL) {
    uVar11 = this->settings->options;
    UVar5 = UCOL_EQUAL;
    if ((0xefff < (int)uVar11) && (*pUStack_458 < U_ILLEGAL_ARGUMENT_ERROR)) {
      lVar6 = (long)(int)uStack_464;
      UStack_220._vptr_UObject = (_func_int **)(s + lVar6);
      uVar8 = 0;
      if (0 < (int)uStack_460) {
        uVar8 = uStack_464;
      }
      nfcImpl = this->data->nfcImpl;
      iStack_214 = uStack_460 - uVar8;
      if ((uVar11 & 1) == 0) {
        auStack_240._24_8_ = 0xffffffff;
        auStack_240._0_8_ = &PTR__UObject_0039a9f8;
        iStack_218 = 0;
        auStack_450._24_8_ = 0xffffffff;
        auStack_450._0_8_ = &PTR__UObject_0039a9f8;
        iStack_428 = 0;
        UStack_430._vptr_UObject = (_func_int **)(s_00 + lVar6);
        iStack_424 = uVar4 - uVar8;
        UVar5 = anon_unknown_16::compareNFDIter
                          (nfcImpl,(NFDIterator *)auStack_240,(NFDIterator *)auStack_450);
        UObject::~UObject((UObject *)auStack_450);
        UObject::~UObject((UObject *)auStack_240);
      }
      else {
        anon_unknown_16::FCDUTF8NFDIterator::FCDUTF8NFDIterator
                  ((FCDUTF8NFDIterator *)auStack_240,this->data,(uint8_t *)UStack_220._vptr_UObject,
                   iStack_214);
        anon_unknown_16::FCDUTF8NFDIterator::FCDUTF8NFDIterator
                  ((FCDUTF8NFDIterator *)auStack_450,this->data,s_00 + lVar6,uVar4 - uVar8);
        UVar5 = anon_unknown_16::compareNFDIter
                          (nfcImpl,(NFDIterator *)auStack_240,(NFDIterator *)auStack_450);
        anon_unknown_16::FCDUTF8NFDIterator::~FCDUTF8NFDIterator((FCDUTF8NFDIterator *)auStack_450);
        anon_unknown_16::FCDUTF8NFDIterator::~FCDUTF8NFDIterator((FCDUTF8NFDIterator *)auStack_240);
      }
    }
  }
  return UVar5;
}

Assistant:

UCollationResult
RuleBasedCollator::compareUTF8(const StringPiece &left, const StringPiece &right,
                               UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return UCOL_EQUAL; }
    const uint8_t *leftBytes = reinterpret_cast<const uint8_t *>(left.data());
    const uint8_t *rightBytes = reinterpret_cast<const uint8_t *>(right.data());
    if((leftBytes == NULL && !left.empty()) || (rightBytes == NULL && !right.empty())) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return UCOL_EQUAL;
    }
    return doCompare(leftBytes, left.length(), rightBytes, right.length(), errorCode);
}